

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O0

void __thiscall Imaginer::Utils::iRpn::iRpn(iRpn *this,char *expname)

{
  iStack<char> *this_00;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_01;
  int local_34;
  char local_2d [17];
  int local_1c;
  char *local_18;
  char *expname_local;
  iRpn *this_local;
  
  this->_expnames = expname;
  this->_curpos = 0;
  local_18 = expname;
  expname_local = (char *)this;
  this_00 = (iStack<char> *)operator_new(0x10);
  local_1c = 0x400;
  iStack<char>::iStack(this_00,&local_1c);
  this->_operator = this_00;
  local_2d[0] = '#';
  iStack<char>::push(this->_operator,local_2d);
  this_01 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)operator_new(0x10);
  local_34 = 0x400;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(this_01,&local_34);
  this->_operands = this_01;
  return;
}

Assistant:

iRpn::iRpn(char* expname):_expnames(expname),_curpos(0)
{
    _operator = new iStack<char>;
    _operator->push('#');
    _operands = new iStack<RPNnode>;
}